

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O0

string * __thiscall
TargetFilesystemArtifact<ArtifactNameTag,_ArtifactDirTag>::Evaluate
          (string *__return_storage_ptr__,
          TargetFilesystemArtifact<ArtifactNameTag,_ArtifactDirTag> *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *dagChecker)

{
  cmGeneratorTarget *pcVar1;
  bool bVar2;
  TargetType TVar3;
  const_reference pvVar4;
  cmGeneratorTarget *pcVar5;
  GeneratorExpressionContent *pGVar6;
  pair<std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>,_bool> pVar7;
  undefined1 local_200 [8];
  string result;
  allocator<char> local_1b9;
  string local_1b8;
  string local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  string local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string local_d8;
  cmGeneratorTarget *local_b8;
  cmGeneratorTarget *target;
  string local_a8;
  string local_88;
  undefined1 local_58 [8];
  string name;
  cmGeneratorExpressionDAGChecker *dagChecker_local;
  GeneratorExpressionContent *content_local;
  cmGeneratorExpressionContext *context_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *parameters_local;
  TargetFilesystemArtifact<ArtifactNameTag,_ArtifactDirTag> *this_local;
  
  pGVar6 = content;
  name.field_2._8_8_ = dagChecker;
  pvVar4 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::front(parameters);
  std::__cxx11::string::string((string *)local_58,(string *)pvVar4);
  bVar2 = cmGeneratorExpression::IsValidTargetName((string *)local_58);
  if (bVar2) {
    local_b8 = cmLocalGenerator::FindGeneratorTargetToUse(context->LG,(string *)local_58);
    if (local_b8 == (cmGeneratorTarget *)0x0) {
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_d8,content);
      std::operator+(&local_118,"No target \"",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
      std::operator+(&local_f8,&local_118,"\"");
      reportError(context,&local_d8,&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_118);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      target._0_4_ = 1;
    }
    else {
      TVar3 = cmGeneratorTarget::GetType(local_b8);
      if (((int)TVar3 < 4) ||
         (TVar3 = cmGeneratorTarget::GetType(local_b8), TVar3 == UNKNOWN_LIBRARY)) {
        if ((name.field_2._8_8_ == 0) ||
           ((bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries
                               ((cmGeneratorExpressionDAGChecker *)name.field_2._8_8_,local_b8),
            !bVar2 && ((bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingSources
                                          ((cmGeneratorExpressionDAGChecker *)name.field_2._8_8_),
                       pcVar1 = local_b8, !bVar2 ||
                       (pcVar5 = cmGeneratorExpressionDAGChecker::TopTarget
                                           ((cmGeneratorExpressionDAGChecker *)name.field_2._8_8_),
                       pcVar1 != pcVar5)))))) {
          std::
          set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
          ::insert(&context->DependTargets,&local_b8);
          pVar7 = std::
                  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                  ::insert(&context->AllTargets,&local_b8);
          result.field_2._8_8_ = pVar7.first._M_node;
          TargetFilesystemArtifactResultCreator<ArtifactNameTag>::Create_abi_cxx11_
                    ((string *)local_200,
                     (TargetFilesystemArtifactResultCreator<ArtifactNameTag> *)local_b8,
                     (cmGeneratorTarget *)context,(cmGeneratorExpressionContext *)content,pGVar6);
          if ((context->HadError & 1U) == 0) {
            TargetFilesystemArtifactResultGetter<ArtifactDirTag>::Get
                      (__return_storage_ptr__,(string *)local_200);
          }
          else {
            std::__cxx11::string::string((string *)__return_storage_ptr__);
          }
          target._0_4_ = 1;
          std::__cxx11::string::~string((string *)local_200);
        }
        else {
          GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_198,content);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1b8,
                     "Expressions which require the linker language may not be used while evaluating link libraries"
                     ,&local_1b9);
          reportError(context,&local_198,&local_1b8);
          std::__cxx11::string::~string((string *)&local_1b8);
          std::allocator<char>::~allocator(&local_1b9);
          std::__cxx11::string::~string((string *)&local_198);
          std::__cxx11::string::string((string *)__return_storage_ptr__);
          target._0_4_ = 1;
        }
      }
      else {
        GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_138,content);
        std::operator+(&local_178,"Target \"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58
                      );
        std::operator+(&local_158,&local_178,"\" is not an executable or library.");
        reportError(context,&local_138,&local_158);
        std::__cxx11::string::~string((string *)&local_158);
        std::__cxx11::string::~string((string *)&local_178);
        std::__cxx11::string::~string((string *)&local_138);
        std::__cxx11::string::string((string *)__return_storage_ptr__);
        target._0_4_ = 1;
      }
    }
  }
  else {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_88,content);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"Expression syntax not recognized.",
               (allocator<char> *)((long)&target + 7));
    reportError(context,&local_88,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&target + 7));
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    target._0_4_ = 1;
  }
  std::__cxx11::string::~string((string *)local_58);
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(
    const std::vector<std::string>& parameters,
    cmGeneratorExpressionContext* context,
    const GeneratorExpressionContent* content,
    cmGeneratorExpressionDAGChecker* dagChecker) const override
  {
    // Lookup the referenced target.
    std::string name = parameters.front();

    if (!cmGeneratorExpression::IsValidTargetName(name)) {
      ::reportError(context, content->GetOriginalExpression(),
                    "Expression syntax not recognized.");
      return std::string();
    }
    cmGeneratorTarget* target = context->LG->FindGeneratorTargetToUse(name);
    if (!target) {
      ::reportError(context, content->GetOriginalExpression(),
                    "No target \"" + name + "\"");
      return std::string();
    }
    if (target->GetType() >= cmStateEnums::OBJECT_LIBRARY &&
        target->GetType() != cmStateEnums::UNKNOWN_LIBRARY) {
      ::reportError(context, content->GetOriginalExpression(),
                    "Target \"" + name +
                      "\" is not an executable or library.");
      return std::string();
    }
    if (dagChecker &&
        (dagChecker->EvaluatingLinkLibraries(target) ||
         (dagChecker->EvaluatingSources() &&
          target == dagChecker->TopTarget()))) {
      ::reportError(context, content->GetOriginalExpression(),
                    "Expressions which require the linker language may not "
                    "be used while evaluating link libraries");
      return std::string();
    }
    context->DependTargets.insert(target);
    context->AllTargets.insert(target);

    std::string result =
      TargetFilesystemArtifactResultCreator<ArtifactT>::Create(target, context,
                                                               content);
    if (context->HadError) {
      return std::string();
    }
    return TargetFilesystemArtifactResultGetter<ComponentT>::Get(result);
  }